

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O1

Type * __thiscall slang::ast::TypeParameterSymbol::getTypeAlias(TypeParameterSymbol *this)

{
  SymbolIndex SVar1;
  Scope *pSVar2;
  SyntaxNode *pSVar3;
  TypeAliasType *pTVar4;
  
  pTVar4 = (TypeAliasType *)this->typeAlias;
  if (pTVar4 == (TypeAliasType *)0x0) {
    pSVar2 = (this->super_Symbol).parentScope;
    if (pSVar2 == (Scope *)0x0) {
      assert::assertFailed
                ("scope",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/ParameterSymbols.cpp"
                 ,0xbb,"const Type &slang::ast::TypeParameterSymbol::getTypeAlias() const");
    }
    pTVar4 = BumpAllocator::
             emplace<slang::ast::TypeAliasType,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&>
                       (&pSVar2->compilation->super_BumpAllocator,&(this->super_Symbol).name,
                        &(this->super_Symbol).location);
    pSVar3 = (this->super_Symbol).originatingSyntax;
    if (pSVar3 != (SyntaxNode *)0x0) {
      (pTVar4->super_Type).super_Symbol.originatingSyntax = pSVar3;
    }
    DeclaredType::setLink(&pTVar4->targetType,&this->targetType);
    SVar1 = (this->super_Symbol).indexInScope;
    (pTVar4->super_Type).super_Symbol.parentScope = pSVar2;
    (pTVar4->super_Type).super_Symbol.indexInScope = SVar1;
    this->typeAlias = &pTVar4->super_Type;
  }
  return &pTVar4->super_Type;
}

Assistant:

const Type& TypeParameterSymbol::getTypeAlias() const {
    if (typeAlias)
        return *typeAlias;

    auto scope = getParentScope();
    ASSERT(scope);

    auto alias = scope->getCompilation().emplace<TypeAliasType>(name, location);
    if (auto syntax = getSyntax())
        alias->setSyntax(*syntax);

    alias->targetType.setLink(targetType);
    alias->setParent(*scope, getIndex());

    typeAlias = alias;
    return *typeAlias;
}